

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O1

void reset_mem_pool(mem_pool **root,size_t target_used_mem)

{
  ulong uVar1;
  mem_pool *pmVar2;
  ulong uVar3;
  mem_pool *pmVar4;
  mem_pool *pmVar5;
  
  pmVar5 = *root;
  uVar3 = pmVar5->size;
  for (pmVar4 = pmVar5->prev; pmVar4 != (mem_pool *)0x0; pmVar4 = pmVar4->prev) {
    uVar3 = uVar3 + pmVar4->size;
  }
  if ((pmVar5->prev != (mem_pool *)0x0) &&
     (pmVar4 = pmVar5, pmVar2 = pmVar5->prev, target_used_mem < uVar3)) {
    while( true ) {
      pmVar5 = pmVar2;
      uVar1 = pmVar4->size;
      if (uVar1 < uVar3 - target_used_mem) break;
      pmVar4->size = 0;
      if ((pmVar5->prev == (mem_pool *)0x0) ||
         (uVar3 = uVar3 - uVar1, pmVar4 = pmVar5, pmVar2 = pmVar5->prev, uVar3 <= target_used_mem))
      goto LAB_0010b10c;
    }
    pmVar4->size = uVar1 - (uVar3 - target_used_mem);
    pmVar5 = pmVar4;
  }
LAB_0010b10c:
  *root = pmVar5;
  return;
}

Assistant:

void reset_mem_pool(struct mem_pool** root, size_t target_used_mem) {
    struct mem_pool* cur = *root;
    size_t used_mem = get_used_mem(cur);
    while (cur->prev && used_mem > target_used_mem) {
        if (used_mem - target_used_mem > cur->size) {
            cur->size -= used_mem - target_used_mem;
            break;
        } else {
            used_mem -= cur->size;
            cur->size = 0;
            cur = cur->prev;
        }
    }
    *root = cur;
}